

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IR.cpp
# Opt level: O3

void __thiscall IR::Instr::TransferTo(Instr *this,Instr *instr)

{
  ushort uVar1;
  Opnd *pOVar2;
  _func_int **pp_Var3;
  code *pcVar4;
  bool bVar5;
  OpndKind OVar6;
  undefined4 *puVar7;
  ushort uVar8;
  ushort uVar9;
  ushort uVar10;
  ushort uVar11;
  ushort uVar12;
  ushort uVar13;
  ushort uVar14;
  ushort uVar15;
  ushort uVar16;
  ushort uVar17;
  ushort uVar18;
  ushort uVar19;
  ushort uVar20;
  
  if (instr->m_dst != (Opnd *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar7 = 1;
    bVar5 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IR.cpp"
                       ,0xc64,"(instr->m_dst == nullptr)","instr->m_dst == nullptr");
    if (!bVar5) goto LAB_004b9518;
    *puVar7 = 0;
  }
  if (instr->m_src1 != (Opnd *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar7 = 1;
    bVar5 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IR.cpp"
                       ,0xc65,"(instr->m_src1 == nullptr)","instr->m_src1 == nullptr");
    if (!bVar5) goto LAB_004b9518;
    *puVar7 = 0;
  }
  if (instr->m_src2 != (Opnd *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar7 = 1;
    bVar5 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IR.cpp"
                       ,0xc66,"(instr->m_src2 == nullptr)","instr->m_src2 == nullptr");
    if (!bVar5) goto LAB_004b9518;
    *puVar7 = 0;
  }
  uVar8 = *(ushort *)&this->field_0x36 & 2;
  uVar1 = *(ushort *)&instr->field_0x36;
  *(ushort *)&instr->field_0x36 = uVar1 & 0xfffd | uVar8;
  uVar9 = *(ushort *)&this->field_0x36 & 4;
  *(ushort *)&instr->field_0x36 = uVar1 & 0xfff9 | uVar8 | uVar9;
  uVar10 = *(ushort *)&this->field_0x36 & 8;
  *(ushort *)&instr->field_0x36 = uVar1 & 0xfff1 | uVar8 | uVar9 | uVar10;
  uVar11 = *(ushort *)&this->field_0x36 & 0x10;
  *(ushort *)&instr->field_0x36 = uVar1 & 0xffe1 | uVar8 | uVar9 | uVar10 | uVar11;
  instr->field_0x38 = instr->field_0x38 & 0xf7 | this->field_0x38 & 8;
  uVar12 = *(ushort *)&this->field_0x36 & 0x40;
  *(ushort *)&instr->field_0x36 = uVar1 & 0xffa1 | uVar8 | uVar9 | uVar10 | uVar11 | uVar12;
  uVar13 = *(ushort *)&this->field_0x36 & 0x80;
  *(ushort *)&instr->field_0x36 = uVar1 & 0xff21 | uVar8 | uVar9 | uVar10 | uVar11 | uVar12 | uVar13
  ;
  uVar14 = *(ushort *)&this->field_0x36 & 0x100;
  *(ushort *)&instr->field_0x36 =
       uVar1 & 0xfe21 | uVar8 | uVar9 | uVar10 | uVar11 | uVar12 | uVar13 | uVar14;
  instr->ignoreOverflowBitCount = this->ignoreOverflowBitCount;
  uVar15 = *(ushort *)&this->field_0x36 & 0x400;
  *(ushort *)&instr->field_0x36 =
       uVar1 & 0xfa21 | uVar8 | uVar9 | uVar10 | uVar11 | uVar12 | uVar13 | uVar14 | uVar15;
  uVar16 = *(ushort *)&this->field_0x36 & 0x800;
  *(ushort *)&instr->field_0x36 =
       uVar1 & 0xf221 | uVar8 | uVar9 | uVar10 | uVar11 | uVar12 | uVar13 | uVar14 | uVar15 | uVar16
  ;
  uVar17 = *(ushort *)&this->field_0x36 & 0x1000;
  *(ushort *)&instr->field_0x36 =
       uVar1 & 0xe221 | uVar8 | uVar9 | uVar10 | uVar11 | uVar12 | uVar13 | uVar14 | uVar15 | uVar16
       | uVar17;
  instr->m_number = this->m_number;
  pOVar2 = this->m_src2;
  instr->m_src1 = this->m_src1;
  instr->m_src2 = pOVar2;
  uVar18 = *(ushort *)&this->field_0x36 & 0x4000;
  *(ushort *)&instr->field_0x36 =
       uVar1 & 0xa221 | uVar8 | uVar9 | uVar10 | uVar11 | uVar12 | uVar13 | uVar14 | uVar15 | uVar16
       | uVar17 | uVar18;
  uVar19 = *(ushort *)&this->field_0x36 & 0x8000;
  *(ushort *)&instr->field_0x36 =
       uVar1 & 0x2221 | uVar8 | uVar9 | uVar10 | uVar11 | uVar12 | uVar13 | uVar14 | uVar15 | uVar16
       | uVar17 | uVar18 | uVar19;
  instr->dataWidth = this->dataWidth;
  uVar20 = *(ushort *)&this->field_0x36 & 0x2000;
  *(ushort *)&instr->field_0x36 =
       uVar1 & 0x221 | uVar8 | uVar9 | uVar10 | uVar11 | uVar12 | uVar13 | uVar14 | uVar15 | uVar16
       | uVar17 | uVar18 | uVar19 | uVar20;
  *(ushort *)&instr->field_0x36 =
       uVar1 & 0x21 | uVar8 | uVar9 | uVar10 | uVar11 | uVar12 | uVar13 | uVar14 | uVar15 | uVar16 |
       uVar17 | uVar18 | uVar19 | uVar20 | *(ushort *)&this->field_0x36 & 0x200;
  pOVar2 = this->m_dst;
  if (pOVar2 != (Opnd *)0x0) {
    instr->m_dst = pOVar2;
    this->m_dst = (Opnd *)0x0;
    OVar6 = Opnd::GetKind(pOVar2);
    if (OVar6 != OpndKindReg) goto LAB_004b94ff;
    OVar6 = Opnd::GetKind(pOVar2);
    if (OVar6 != OpndKindReg) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar7 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar7 = 1;
      bVar5 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                         ,0x79,"(this->IsRegOpnd())","Bad call to AsRegOpnd()");
      if (!bVar5) goto LAB_004b9518;
      *puVar7 = 0;
    }
    pp_Var3 = pOVar2[1]._vptr_Opnd;
    if ((*(char *)((long)pp_Var3 + 0x14) == '\x01') && (((ulong)pp_Var3[3] & 1) != 0)) {
      if ((Instr *)pp_Var3[5] != this) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar7 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
        *puVar7 = 1;
        bVar5 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IR.cpp"
                           ,0xc84,"(sym->AsStackSym()->m_instrDef == this)",
                           "sym->AsStackSym()->m_instrDef == this");
        if (!bVar5) {
LAB_004b9518:
          pcVar4 = (code *)invalidInstructionException();
          (*pcVar4)();
        }
        *puVar7 = 0;
        if (*(char *)((long)pp_Var3 + 0x14) != '\x01') {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          puVar7 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
          *puVar7 = 1;
          bVar5 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Sym.inl"
                             ,0x1f,"(this->IsStackSym())","Bad call to AsStackSym()");
          if (!bVar5) goto LAB_004b9518;
          *puVar7 = 0;
        }
      }
      pp_Var3[5] = (_func_int *)instr;
    }
  }
LAB_004b94ff:
  this->m_src1 = (Opnd *)0x0;
  this->m_src2 = (Opnd *)0x0;
  return;
}

Assistant:

void
Instr::TransferTo(Instr * instr)
{
    Assert(instr->m_dst == nullptr);
    Assert(instr->m_src1 == nullptr);
    Assert(instr->m_src2 == nullptr);
    this->TransferDstAttributesTo(instr);
    instr->usesStackArgumentsObject = this->usesStackArgumentsObject;
    instr->isCloned = this->isCloned;
    instr->ignoreNegativeZero = this->ignoreNegativeZero;
    instr->ignoreIntOverflow = this->ignoreIntOverflow;
    instr->ignoreIntOverflowInRange = this->ignoreIntOverflowInRange;
    instr->ignoreOverflowBitCount = this->ignoreOverflowBitCount;
    instr->loadedArrayHeadSegment = this->loadedArrayHeadSegment;
    instr->loadedArrayHeadSegmentLength = this->loadedArrayHeadSegmentLength;
    instr->extractedUpperBoundCheckWithoutHoisting = this->extractedUpperBoundCheckWithoutHoisting;
    instr->m_number = this->m_number;
    instr->m_src1 = this->m_src1;
    instr->m_src2 = this->m_src2;
    instr->dstIsAlwaysConvertedToInt32 = this->dstIsAlwaysConvertedToInt32;
    instr->dstIsAlwaysConvertedToNumber = this->dstIsAlwaysConvertedToNumber;
    instr->dataWidth = this->dataWidth;
    instr->isCtorCall = this->isCtorCall;
    instr->forcePreOpBailOutIfNeeded = this->forcePreOpBailOutIfNeeded;
    IR::Opnd * dst = this->m_dst;

    if (dst)
    {
        instr->m_dst = dst;
        this->m_dst = nullptr;
        if (dst->IsRegOpnd())
        {
            Sym * sym = dst->AsRegOpnd()->m_sym;
            if (sym->IsStackSym() && sym->AsStackSym()->m_isSingleDef)
            {
                Assert(sym->AsStackSym()->m_instrDef == this);
                StackSym * stackSym = sym->AsStackSym();
                stackSym->m_instrDef = instr;
            }
        }
    }

    this->m_src1 = nullptr;
    this->m_src2 = nullptr;
}